

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O2

void testwin5(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  Am_Style local_50 [8];
  Am_Drawonable *d5_array [3];
  
  puts("Entering testwin5:");
  uVar4 = 0;
  printf("  Hit RETURN to create an invisible locally-scoped window:");
  getchar();
  uVar3 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 8 - uVar4 != 0; uVar4 = uVar4 + 8) {
    pAVar1 = (&wins_ar->root)[uVar4];
    Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
    uVar2 = (*(code *)**(undefined8 **)pAVar1)
                      (pAVar1,10,0x28,200,200,"D5","D5 Icon",0,0,local_50,0,1,1,0,0,1,0,0,1,0);
    *(undefined8 *)((long)d5_array + uVar4) = uVar2;
    Am_Style::~Am_Style(local_50);
  }
  printf("  Hit RETURN to toggle visibility of locally-scoped window: ");
  getchar();
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    (**(code **)(*(long *)d5_array[uVar4] + 0x70))(d5_array[uVar4],1);
  }
  printf("  Hit RETURN to \"Destroy\" locally-scoped window:");
  getchar();
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    (**(code **)(*(long *)d5_array[uVar4] + 8))();
  }
  return;
}

Assistant:

void
testwin5(wins *wins_ar, int ar_len)
{
  printf("Entering testwin5:\n");
  printf("  Hit RETURN to create an invisible locally-scoped window:");
  getchar();

  int i;
  Am_Drawonable *d5_array[3]; // Maximum value ar_len could be
  for (i = 0; i < ar_len; i++) {
    d5_array[i] = (wins_ar[i].root)
                      ->Create(10, 40, 200, 200, "D5", "D5 Icon",
                               // visibility
                               false);
  }

  printf("  Hit RETURN to toggle visibility of locally-scoped window: ");
  getchar();
  for (i = 0; i < ar_len; i++) {
    d5_array[i]->Set_Visible(true);
  }

  printf("  Hit RETURN to \"Destroy\" locally-scoped window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    d5_array[i]->Destroy();
  }
}